

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_model(Net *this,DataReader *dr)

{
  pointer ppLVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  int iVar4;
  int iVar5;
  PoolAllocator *pPVar6;
  uint uVar7;
  ulong uVar8;
  ModelBinFromDataReader mb;
  Option opt1;
  ModelBinFromDataReader local_80;
  Option local_70;
  
  ppLVar1 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar1 == ppLVar2) {
    load_model();
    iVar4 = -1;
  }
  else {
    ModelBinFromDataReader::ModelBinFromDataReader(&local_80,dr);
    uVar7 = (uint)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3);
    if ((int)uVar7 < 1) {
      iVar4 = 0;
    }
    else {
      uVar8 = 0;
      do {
        pLVar3 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8];
        if (pLVar3 == (Layer *)0x0) {
          fprintf(_stderr,"load_model error at layer %d, parameter file has inconsistent content.",
                  uVar8 & 0xffffffff);
LAB_0016ecab:
          fputc(10,_stderr);
          iVar4 = -1;
          goto LAB_0016eb5e;
        }
        iVar4 = (*pLVar3->_vptr_Layer[3])(pLVar3,&local_80);
        if (iVar4 != 0) {
          fprintf(_stderr,"layer load_model %d %s failed",uVar8 & 0xffffffff,
                  (pLVar3->name)._M_dataplus._M_p);
          goto LAB_0016ecab;
        }
        if (pLVar3->support_int8_storage == true) {
          (this->opt).use_vulkan_compute = false;
        }
        uVar8 = uVar8 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar8);
      iVar4 = 0;
LAB_0016eb5e:
      if (0 < (int)uVar7) {
        uVar8 = 0;
        do {
          pLVar3 = (this->d->layers).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
          get_masked_option(&local_70,&this->opt,pLVar3->featmask);
          iVar5 = (*pLVar3->_vptr_Layer[4])(pLVar3,&local_70);
          if (iVar5 != 0) {
            load_model();
            iVar4 = -1;
            break;
          }
          uVar8 = uVar8 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar8);
      }
    }
    if ((this->opt).use_local_pool_allocator == true) {
      if (((this->opt).blob_allocator == (Allocator *)0x0) &&
         (this->d->local_blob_allocator == (PoolAllocator *)0x0)) {
        pPVar6 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator(pPVar6);
        this->d->local_blob_allocator = pPVar6;
        PoolAllocator::set_size_compare_ratio(pPVar6,0.0);
      }
      if (((this->opt).workspace_allocator == (Allocator *)0x0) &&
         (this->d->local_workspace_allocator == (PoolAllocator *)0x0)) {
        pPVar6 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator(pPVar6);
        this->d->local_workspace_allocator = pPVar6;
        PoolAllocator::set_size_compare_ratio(pPVar6,0.0);
      }
    }
    ModelBinFromDataReader::~ModelBinFromDataReader(&local_80);
  }
  return iVar4;
}

Assistant:

int Net::load_model(const DataReader& dr)
{
    if (d->layers.empty())
    {
        NCNN_LOGE("network graph not ready");
        return -1;
    }

    int layer_count = (int)d->layers.size();

    // load file
    int ret = 0;

    ModelBinFromDataReader mb(dr);
    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        //Here we found inconsistent content in the parameter file.
        if (!layer)
        {
            NCNN_LOGE("load_model error at layer %d, parameter file has inconsistent content.", i);
            ret = -1;
            break;
        }

        int lret = layer->load_model(mb);
        if (lret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_model %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_model %d failed", i);
#endif
            ret = -1;
            break;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!opt.pipeline_cache)
        {
            if (!d->pipeline_cache)
                d->pipeline_cache = new PipelineCache(d->vkdev);
            opt.pipeline_cache = d->pipeline_cache;
        }
    }
#endif // NCNN_VULKAN

    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (opt1.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
        else
        {
            layer->vkdev = 0;
            layer->support_vulkan = false;
        }
#endif // NCNN_VULKAN

        int cret = layer->create_pipeline(opt1);
        if (cret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer create_pipeline %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer create_pipeline %d failed", i);
#endif
            ret = -1;
            break;
        }
    }

    if (opt.use_local_pool_allocator)
    {
        if (opt.blob_allocator == 0)
        {
            if (!d->local_blob_allocator)
            {
                d->local_blob_allocator = new PoolAllocator;
                d->local_blob_allocator->set_size_compare_ratio(0.f);
            }
        }
        if (opt.workspace_allocator == 0)
        {
            if (!d->local_workspace_allocator)
            {
                d->local_workspace_allocator = new PoolAllocator;
                d->local_workspace_allocator->set_size_compare_ratio(0.f);
            }
        }
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        d->upload_model();
    }
#endif // NCNN_VULKAN

    return ret;
}